

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

int picnic_impl_verify(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t siglen)

{
  undefined1 auVar1 [64];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  void *__s2;
  sbyte sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  view_t *pvVar16;
  view_t *pvVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  uint8_t *salt;
  byte *pbVar25;
  ushort *puVar26;
  undefined8 extraout_RAX;
  uint8_t *puVar27;
  _Bool _Var28;
  byte *pbVar29;
  ulong uVar30;
  BitLength BVar31;
  byte bVar32;
  uint uVar33;
  byte *pbVar34;
  undefined8 extraout_RDX;
  undefined8 uVar35;
  bool bVar36;
  uint uVar37;
  proof_round_t *prf_round;
  uint8_t *puVar38;
  uint uVar39;
  uint uVar40;
  byte *pbVar41;
  byte *pbVar42;
  ulong uVar43;
  byte bVar44;
  uint8_t *puVar45;
  kdf_shake_x4_t *kdf;
  Keccak_HashInstancetimes4 *instance;
  kdf_shake_t *kdf_00;
  uint16_t uVar46;
  uint uVar47;
  uint8_t *puVar48;
  ushort *puVar49;
  long lVar50;
  ulong uVar51;
  uint uVar52;
  byte bVar53;
  ulong uVar54;
  long lVar55;
  byte *pbVar56;
  bool bVar57;
  undefined1 auVar58 [64];
  uint b_i_1;
  uint c_i_1;
  uint a_i;
  uint c_i;
  uint8_t hash [64];
  uint b_i;
  in_out_shares_t in_out_shares;
  uint8_t *seeds [4];
  uchar challenge [438];
  ulong local_a08;
  undefined1 local_980 [16];
  undefined1 *puStack_970;
  undefined1 *puStack_968;
  undefined1 auStack_960 [32];
  ulong local_938;
  ulong local_930;
  ulong local_928;
  ulong local_920;
  uint8_t *local_918;
  ushort *local_910;
  ulong local_908;
  view_t *local_900;
  view_t *local_8f8;
  ulong local_8f0;
  uint local_8e8;
  int local_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [40];
  uint8_t *local_878;
  ulong local_870;
  zkbpp_lowmc_verify_implementation_f local_868;
  ulong local_860;
  ulong local_858;
  undefined8 local_850;
  ulong local_848;
  undefined1 local_840 [16];
  uint8_t *puStack_830;
  uint8_t *apuStack_828 [5];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [128];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 auStack_5c0 [54];
  uchar local_58a [10];
  undefined1 auStack_580 [54];
  kdf_shake_x4_t local_3c8;
  
  uVar5 = pp->num_rounds;
  bVar32 = pp->input_output_size;
  uVar24 = (ulong)bVar32;
  bVar18 = pp->digest_size;
  bVar53 = pp->view_size;
  salt = (uint8_t *)calloc(1,(ulong)((uint)uVar5 * 0x90) + 0x28);
  if (salt != (uint8_t *)0x0) {
    _Var28 = context->unruh;
    uVar37 = bVar53 + 7 & 0xfffffff8;
    uVar51 = (ulong)uVar37;
    uVar33 = (uint)bVar53 + (uint)bVar32 * 2;
    uVar19 = 0;
    if (_Var28 != false) {
      uVar19 = uVar33;
    }
    uVar54 = (ulong)(uVar5 + 7 & 0xfffffff8);
    pbVar25 = (byte *)calloc(1,((uint)bVar32 + (uint)bVar32 * 4 + uVar37 + (uVar19 + bVar18) * 2) *
                               (uint)uVar5 + uVar54);
    pbVar29 = pbVar25 + uVar54;
    *(byte **)(salt + 0x20) = pbVar25;
    if (uVar5 != 0) {
      uVar30 = (ulong)((uint)bVar18 + (uint)bVar18);
      lVar50 = 0;
      lVar55 = uVar54 + uVar51 + uVar30;
      pbVar34 = pbVar25 + uVar24 + lVar55;
      pbVar42 = pbVar25 + lVar55;
      do {
        pbVar56 = pbVar42;
        pbVar41 = pbVar34;
        *(byte **)(salt + lVar50 + 0x40) = pbVar29;
        *(byte **)(salt + lVar50 + 0x48) = pbVar29 + bVar18;
        pbVar29 = pbVar29 + bVar18 + bVar18;
        lVar50 = lVar50 + 0x90;
        pbVar34 = pbVar41 + uVar30;
        pbVar42 = pbVar56 + uVar30;
      } while ((ulong)uVar5 * 0x90 != lVar50);
      lVar50 = 0;
      do {
        pbVar42 = pbVar56;
        pbVar34 = pbVar41;
        *(byte **)(salt + lVar50 + 0x70) = pbVar29;
        pbVar29 = pbVar29 + uVar51;
        lVar50 = lVar50 + 0x90;
        pbVar41 = pbVar34 + uVar51;
        pbVar56 = pbVar42 + uVar51;
      } while ((ulong)uVar5 * 0x90 != lVar50);
      lVar50 = 0;
      do {
        *(byte **)(salt + lVar50 + 0x88) = pbVar42;
        pbVar42 = pbVar42 + uVar24 * 3;
        *(byte **)(salt + lVar50 + 0x90) = pbVar29 + uVar24;
        pbVar29 = pbVar34 + uVar24;
        pbVar34 = pbVar34 + uVar24 * 3;
        *(byte **)(salt + lVar50 + 0x98) = pbVar29;
        pbVar29 = pbVar29 + uVar24;
        lVar50 = lVar50 + 0x90;
      } while ((ulong)uVar5 * 0x90 != lVar50);
      if (_Var28 != false) {
        lVar50 = 0;
        do {
          *(byte **)(salt + lVar50 + 0xa0) = pbVar29;
          *(byte **)(salt + lVar50 + 0xa8) = pbVar29 + uVar33;
          pbVar29 = pbVar29 + uVar33 + uVar33;
          lVar50 = lVar50 + 0x90;
        } while ((ulong)uVar5 * 0x90 != lVar50);
      }
    }
    uVar51 = (ulong)(uVar5 + 7 + (uint)uVar5 >> 3);
    local_a08 = siglen - uVar51;
    if (uVar51 <= siglen) {
      bVar2 = pp->seed_size;
      bVar3 = (pp->lowmc).r;
      bVar4 = (pp->lowmc).m;
      uVar6 = (pp->lowmc).n;
      if (uVar5 == 0) {
        uVar51 = 0;
      }
      else {
        uVar51 = 0;
        do {
          bVar44 = (byte)uVar51 & 6;
          bVar44 = (~(byte)(-1 << ((byte)(8 - bVar44) & 0x1f)) & sig[uVar51 >> 3]) >> (bVar44 ^ 6);
          if (bVar44 == 3) goto LAB_0011951e;
          uVar51 = uVar51 + 2;
          *pbVar25 = bVar44 >> 1 | bVar44 * '\x02' & 2;
          pbVar25 = pbVar25 + 1;
        } while ((uint)uVar5 + (uint)uVar5 != uVar51);
      }
      uVar33 = 8 - ((uint)uVar51 & 6);
      bVar44 = (byte)uVar33;
      sVar9 = (bVar44 < 0x21) * (' ' - bVar44);
      uVar19 = 0;
      if (((uint)sig[uVar51 >> 3] << sVar9) >> sVar9 == 0) {
        uVar19 = (uint)(uVar33 + uVar51 >> 3);
      }
      if ((uVar19 != 0) && (0x1f < local_a08)) {
        uVar33 = (uint)bVar32 * 8 - (uint)uVar6;
        local_a08 = local_a08 - 0x20;
        puVar48 = sig + uVar19;
        uVar35 = *(undefined8 *)(puVar48 + 8);
        uVar10 = *(undefined8 *)(puVar48 + 0x10);
        uVar11 = *(undefined8 *)(puVar48 + 0x18);
        *(undefined8 *)salt = *(undefined8 *)puVar48;
        *(undefined8 *)(salt + 8) = uVar35;
        *(undefined8 *)(salt + 0x10) = uVar10;
        *(undefined8 *)(salt + 0x18) = uVar11;
        uVar39 = (uint)bVar32;
        if (uVar5 != 0) {
          puVar45 = salt + 0x28;
          puVar48 = sig + (ulong)uVar19 + 0x20;
          uVar51 = 0;
          uVar19 = ~(0xff << (uVar33 & 0x1f));
          do {
            bVar44 = *(byte *)(*(long *)(salt + 0x20) + uVar51);
            uVar52 = (uint)bVar44;
            uVar40 = uVar39;
            if (bVar44 == 0) {
              uVar40 = uVar52;
            }
            uVar20 = 0;
            if (bVar44 == 0) {
              uVar20 = uVar39;
            }
            uVar20 = uVar20 + (uint)bVar53 + (uint)bVar32;
            uVar47 = 0;
            if (_Var28 != false) {
              uVar47 = uVar20;
            }
            uVar54 = (ulong)(uVar47 + uVar40 + (uint)bVar53 + (uint)bVar18 + (uint)bVar2 * 2);
            bVar57 = local_a08 < uVar54;
            local_a08 = local_a08 - uVar54;
            if (bVar57) goto LAB_0011951e;
            *(uint8_t **)(puVar45 + 0x28) = puVar48;
            puVar48 = puVar48 + (uint)bVar18;
            if (_Var28 != false) {
              *(uint8_t **)(puVar45 + 0x88) = puVar48;
              puVar48 = puVar48 + uVar20;
            }
            *(uint8_t **)(puVar45 + 0x50) = puVar48;
            if (((uint)puVar48[bVar53 - 1] &
                ~(0xff << ((uint)bVar53 * 8 + (uint)bVar4 * (uint)bVar3 * -3 & 0x1f))) != 0)
            goto LAB_0011951e;
            puVar48 = puVar48 + bVar53;
            *(uint8_t **)puVar45 = puVar48;
            *(uint8_t **)(puVar45 + 8) = puVar48 + bVar2;
            puVar48 = puVar48 + bVar2 + bVar2;
            if (uVar52 == 1) {
              *(byte **)(puVar45 + 0x30) = pbVar29;
              *(uint8_t **)(puVar45 + 0x38) = puVar48;
              if ((uVar19 & puVar48[uVar39 - 1]) != 0) goto LAB_0011951e;
              puVar48 = puVar48 + uVar24;
            }
            else {
              if (uVar52 == 0) {
                *(byte **)(puVar45 + 0x30) = pbVar29;
                pbVar29 = pbVar29 + uVar24;
              }
              else {
                *(uint8_t **)(puVar45 + 0x30) = puVar48;
                if ((uVar19 & puVar48[uVar39 - 1]) != 0) goto LAB_0011951e;
                puVar48 = puVar48 + uVar24;
              }
              *(byte **)(puVar45 + 0x38) = pbVar29;
            }
            pbVar29 = pbVar29 + uVar24;
            uVar51 = uVar51 + 1;
            puVar45 = puVar45 + 0x90;
          } while (uVar5 != uVar51);
        }
        if (local_a08 == 0) {
          local_868 = get_zkbpp_lowmc_verify_implementation(&pp->lowmc);
          lVar50 = (ulong)(pp->lowmc).r * 0x60;
          local_908 = (ulong)uVar5;
          local_8f8 = (view_t *)aligned_alloc(0x20,lVar50);
          uVar51 = local_908;
          local_900 = (view_t *)aligned_alloc(0x20,lVar50);
          puVar26 = (ushort *)malloc((ulong)(uint)((int)uVar51 * 2));
          local_878 = (uint8_t *)aligned_alloc(8,uVar37 * 8);
          uVar19 = 0;
          puVar48 = salt + 0x28;
          local_928 = (ulong)(uVar39 * 8);
          local_920 = (ulong)(uVar39 - 1);
          local_870 = (ulong)((uint)bVar53 * 8);
          local_8f0 = (ulong)uVar37;
          local_720 = vpbroadcastq_avx512vl();
          local_740 = vpbroadcastq_avx512vl();
          local_848 = (ulong)((bVar53 + 7 >> 3) << 5);
          local_910 = puVar26;
          do {
            puVar49 = puVar26;
            if ((short)uVar51 != 0) {
              lVar50 = *(long *)(salt + 0x20);
              uVar30 = 0;
              uVar54 = 0;
              do {
                uVar43 = uVar54;
                if (uVar19 == *(byte *)(lVar50 + uVar30)) {
                  uVar43 = (ulong)((int)uVar54 + 1);
                  puVar26[uVar54] = (ushort)uVar30;
                }
                uVar30 = uVar30 + 1;
                uVar54 = uVar43;
              } while (uVar51 != uVar30);
              uVar39 = (uint)uVar43;
              uVar37 = uVar39 & 0xfffffffc;
              bVar32 = (byte)(0xff << (uVar33 & 0x1f));
              if ((uVar43 & 0xfffffffc) == 0) {
                uVar37 = 0;
              }
              else {
                iVar21 = uVar19 + 1;
                uVar40 = 0;
                local_8e4 = 0;
                if (iVar21 != 3) {
                  local_8e4 = iVar21;
                }
                iVar22 = uVar19 + 2 + ((uVar19 + 2) / 3) * -3;
                local_860 = (ulong)uVar37;
                do {
                  uVar35 = *(undefined8 *)puVar26;
                  kdf = (kdf_shake_x4_t *)local_700;
                  uVar52 = (uint)uVar35 & 0xffff;
                  local_980._0_8_ = uVar35;
                  uVar5 = (ushort)((ulong)uVar35 >> 0x30);
                  uVar47 = (uint)((ulong)uVar35 >> 0x20) & 0xffff;
                  uVar20 = (uint)((ulong)uVar35 >> 0x10) & 0xffff;
                  bVar18 = 0;
                  lVar50 = 0;
                  local_8e8 = uVar40;
                  bVar57 = true;
                  do {
                    bVar36 = bVar57;
                    _Var28 = true;
                    if (!(bool)(bVar36 & iVar21 != 3)) {
                      _Var28 = (_Bool)(bVar18 & iVar22 != 0);
                    }
                    local_840._0_8_ = *(undefined8 *)(puVar48 + lVar50 * 8 + (ulong)(uVar52 * 0x90))
                    ;
                    local_840._8_8_ = *(undefined8 *)(puVar48 + lVar50 * 8 + (ulong)(uVar20 * 0x90))
                    ;
                    puStack_830 = *(uint8_t **)(puVar48 + lVar50 * 8 + (ulong)(uVar47 * 0x90));
                    apuStack_828[0] =
                         *(uint8_t **)(puVar48 + lVar50 * 8 + (ulong)((uint)uVar5 * 0x90));
                    uVar46 = (uint16_t)local_8e4;
                    if (bVar36) {
                      uVar46 = (uint16_t)uVar19;
                    }
                    kdf_init_x4_from_seed
                              (kdf,(uint8_t **)local_840,salt,(uint16_t *)local_980,uVar46,_Var28,pp
                              );
                    lVar50 = 1;
                    bVar18 = 1;
                    kdf = &local_3c8;
                    bVar57 = false;
                  } while (bVar36);
                  if (iVar21 != 3) {
                    local_840._0_8_ = *(undefined8 *)(puVar48 + (ulong)(uVar52 * 0x90) + 0x30);
                    local_840._8_8_ = *(undefined8 *)(puVar48 + (ulong)(uVar20 * 0x90) + 0x30);
                    puStack_830 = *(uint8_t **)(puVar48 + (ulong)(uVar47 * 0x90) + 0x30);
                    apuStack_828[0] = *(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x30);
                    Keccak_HashSqueezetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,
                               local_928);
                  }
                  uVar51 = local_870;
                  if (iVar22 != 0) {
                    local_840._0_8_ = *(undefined8 *)(puVar48 + (ulong)(uVar52 * 0x90) + 0x38);
                    local_840._8_8_ = *(undefined8 *)(puVar48 + (ulong)(uVar20 * 0x90) + 0x38);
                    puStack_830 = *(uint8_t **)(puVar48 + (ulong)(uVar47 * 0x90) + 0x38);
                    apuStack_828[0] = *(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x38);
                    Keccak_HashSqueezetimes4(&local_3c8,(BitSequence **)local_840,local_928);
                  }
                  puVar45 = local_878;
                  uVar54 = local_8f0;
                  instance = (Keccak_HashInstancetimes4 *)local_700;
                  uVar30 = 0;
                  bVar57 = true;
                  do {
                    bVar36 = bVar57;
                    local_840._0_8_ = puVar45 + uVar30 * uVar54;
                    local_840._8_8_ = puVar45 + (uVar30 | 1) * uVar54;
                    puStack_830 = puVar45 + (uVar30 | 2) * uVar54;
                    apuStack_828[0] = puVar45 + (uVar30 | 3) * uVar54;
                    Keccak_HashSqueezetimes4(instance,(BitSequence **)local_840,uVar51);
                    uVar30 = 4;
                    instance = &local_3c8;
                    bVar57 = false;
                  } while (bVar36);
                  lVar50 = 0;
                  do {
                    uVar5 = puVar26[lVar50];
                    if (iVar21 != 3) {
                      *(byte *)(*(long *)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x30) + local_920)
                           = *(byte *)(*(long *)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x30) +
                                      local_920) & bVar32;
                    }
                    mzd_from_char_array((mzd_local_t *)local_8e0,
                                        *(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x30),
                                        uVar24);
                    if (iVar22 != 0) {
                      *(byte *)(*(long *)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x38) + local_920)
                           = *(byte *)(*(long *)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x38) +
                                      local_920) & bVar32;
                    }
                    mzd_from_char_array((mzd_local_t *)local_8c0,
                                        *(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x38),
                                        uVar24);
                    pvVar16 = local_900;
                    decompress_view(local_900,pp,puVar45,0);
                    decompress_view(pvVar16,pp,puVar45 + local_848,1);
                    pvVar17 = local_8f8;
                    decompress_view(local_8f8,pp,
                                    *(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x50),1);
                    (*local_868)(context->m_plaintext,pvVar17,(in_out_shares_t *)local_8e0,pvVar16,
                                 uVar19);
                    compress_view(*(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x48),pp,
                                  pvVar17,0);
                    uVar51 = local_8f0;
                    uVar6 = (pp->lowmc).n;
                    if ((~DAT_001c310c & 0x20400) == 0) {
                      if (uVar6 < 0x81) {
                        local_8a0._0_16_ =
                             vpternlogq_avx512vl(*(undefined1 (*) [16])context->m_key[0].w64,
                                                 local_8c0,local_8e0._0_16_,0x96);
                      }
                      else {
                        auVar14._16_16_ = auStack_8b0;
                        auVar14._0_16_ = local_8c0;
                        auVar12._16_16_ = local_8e0._16_16_;
                        auVar12._0_16_ = local_8e0._0_16_;
                        local_8a0._0_32_ =
                             vpternlogq_avx512vl(*(undefined1 (*) [32])context->m_key[0].w64,auVar14
                                                 ,auVar12,0x96);
                      }
                    }
                    else {
                      local_8a0._0_16_ =
                           vpternlogq_avx512vl(local_8c0,local_8e0._0_16_,
                                               *(undefined1 (*) [16])context->m_key[0].w64,0x96);
                      if (0x80 < uVar6) {
                        local_8a0._16_16_ =
                             vpternlogq_avx512vl(*(undefined1 (*) [16])(context->m_key[0].w64 + 2),
                                                 auStack_8b0,local_8e0._16_16_,0x96);
                      }
                    }
                    mzd_to_char_array(*(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x60),
                                      (mzd_local_t *)local_8e0,uVar24);
                    mzd_to_char_array(*(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x68),
                                      (mzd_local_t *)local_8c0,uVar24);
                    mzd_to_char_array(*(uint8_t **)(puVar48 + (ulong)((uint)uVar5 * 0x90) + 0x70),
                                      (mzd_local_t *)local_8a0,uVar24);
                    lVar50 = lVar50 + 1;
                    puVar45 = puVar45 + uVar51;
                  } while (lVar50 != 4);
                  uVar51 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  puVar45 = (uint8_t *)0x0;
                  do {
                    local_938 = (ulong)pp->digest_size;
                    uVar5 = *puVar26;
                    uVar6 = puVar26[1];
                    uVar7 = puVar26[2];
                    uVar8 = puVar26[3];
                    local_980[0] = 4;
                    if (local_938 == 0x20) {
                      uVar52 = 0x540;
                      uVar40 = 0x100;
                    }
                    else {
                      uVar52 = 0x440;
                      uVar40 = 0x200;
                    }
                    local_930 = uVar51;
                    local_918 = puVar45;
                    Keccak_HashInitializetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,uVar52,uVar40,0,'\x1f');
                    local_840._0_8_ = local_740._0_8_;
                    local_840._8_8_ = local_740._8_8_;
                    puStack_830 = (uint8_t *)local_740._16_8_;
                    apuStack_828[0] = (uint8_t *)local_740._24_8_;
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,8);
                    puVar45 = local_918;
                    puStack_830 = *(uint8_t **)
                                   (puVar48 + (long)local_918 * 8 + (ulong)((uint)uVar7 * 0x90));
                    apuStack_828[0] =
                         *(uint8_t **)(puVar48 + (long)local_918 * 8 + (ulong)((uint)uVar8 * 0x90));
                    local_840._0_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)local_918 * 8 + (ulong)((uint)uVar5 * 0x90));
                    local_840._8_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)local_918 * 8 + (ulong)((uint)uVar6 * 0x90));
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,
                               (ulong)pp->seed_size << 3);
                    Keccak_HashFinaltimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
                    uVar51 = local_938;
                    auVar1 = _local_980;
                    local_980._8_8_ = local_800;
                    local_980._0_8_ = local_840;
                    uVar54 = (ulong)(uint)((int)local_938 * 8);
                    puStack_970 = local_7c0;
                    auStack_960 = auVar1._32_32_;
                    puStack_968 = local_780;
                    Keccak_HashSqueezetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                               uVar54);
                    if (uVar51 == 0x20) {
                      uVar52 = 0x540;
                      uVar40 = 0x100;
                    }
                    else {
                      uVar52 = 0x440;
                      uVar40 = 0x200;
                    }
                    Keccak_HashInitializetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,uVar52,uVar40,0,'\x1f');
                    _local_980 = local_720;
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,8);
                    local_980._8_8_ = local_800;
                    local_980._0_8_ = local_840;
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                               uVar54);
                    local_980._8_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x30);
                    local_980._0_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x30);
                    puStack_970 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar7 * 0x90) + 0x30
                                   );
                    puStack_968 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x30
                                   );
                    local_938 = uVar54;
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                               (ulong)pp->input_output_size << 3);
                    local_980._8_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x48);
                    local_980._0_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x48);
                    puStack_970 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar7 * 0x90) + 0x48
                                   );
                    puStack_968 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x48
                                   );
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                               (ulong)pp->view_size << 3);
                    local_980._8_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x60);
                    local_980._0_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x60);
                    puStack_970 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar7 * 0x90) + 0x60
                                   );
                    puStack_968 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x60
                                   );
                    Keccak_HashUpdatetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                               (ulong)pp->input_output_size << 3);
                    Keccak_HashFinaltimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
                    local_980._8_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x18);
                    local_980._0_8_ =
                         *(undefined8 *)
                          (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x18);
                    puStack_970 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar7 * 0x90) + 0x18
                                   );
                    puStack_968 = (undefined1 *)
                                  *(undefined8 *)
                                   (puVar48 + (long)puVar45 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x18
                                   );
                    Keccak_HashSqueezetimes4
                              ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                               local_938);
                    puVar45 = (uint8_t *)0x1;
                    uVar51 = 0;
                  } while ((local_930 & 1) != 0);
                  if (context->unruh == true) {
                    local_930 = CONCAT71((int7)((ulong)context >> 8),1);
                    uVar35 = 0;
                    BVar31 = 0;
                    do {
                      uVar5 = *puVar26;
                      uVar6 = puVar26[1];
                      uVar7 = puVar26[3];
                      local_858 = (ulong)pp->digest_size;
                      uVar8 = puVar26[2];
                      local_980[0] = 5;
                      if (local_858 == 0x20) {
                        uVar52 = 0x540;
                        uVar40 = 0x100;
                      }
                      else {
                        uVar52 = 0x440;
                        uVar40 = 0x200;
                      }
                      local_938 = BVar31;
                      local_850 = uVar35;
                      Keccak_HashInitializetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,uVar52,uVar40,0,'\x1f');
                      local_840._0_8_ = local_740._0_8_;
                      local_840._8_8_ = local_740._8_8_;
                      puStack_830 = (uint8_t *)local_740._16_8_;
                      apuStack_828[0] = (uint8_t *)local_740._24_8_;
                      Keccak_HashUpdatetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,8)
                      ;
                      uVar51 = local_938;
                      local_840._8_8_ =
                           *(undefined8 *)(puVar48 + local_938 * 8 + (ulong)((uint)uVar6 * 0x90));
                      local_840._0_8_ =
                           *(undefined8 *)(puVar48 + local_938 * 8 + (ulong)((uint)uVar5 * 0x90));
                      puStack_830 = *(uint8_t **)
                                     (puVar48 + local_938 * 8 + (ulong)((uint)uVar8 * 0x90));
                      apuStack_828[0] = *(uint8_t **)(puVar48 + (uint)uVar7 * 0x90 + local_938 * 8);
                      local_918 = puVar48 + (uint)uVar7 * 0x90;
                      Keccak_HashUpdatetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_840,
                                 (ulong)pp->seed_size << 3);
                      Keccak_HashFinaltimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
                      uVar54 = local_858;
                      auVar1 = _local_980;
                      local_980._8_8_ = local_800;
                      local_980._0_8_ = local_840;
                      uVar30 = (ulong)(uint)((int)local_858 * 8);
                      puStack_970 = local_7c0;
                      auStack_960 = auVar1._32_32_;
                      puStack_968 = local_780;
                      Keccak_HashSqueezetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                                 uVar30);
                      if (uVar54 == 0x20) {
                        uVar52 = 0x540;
                        uVar40 = 0x100;
                      }
                      else {
                        uVar52 = 0x440;
                        uVar40 = 0x200;
                      }
                      Keccak_HashInitializetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,uVar52,uVar40,0,'\x1f');
                      bVar18 = uVar19 == 1 & (byte)local_850;
                      bVar53 = uVar19 == 2 & (byte)local_930;
                      local_980._8_8_ = local_800;
                      local_980._0_8_ = local_840;
                      Keccak_HashUpdatetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                                 uVar30);
                      if (bVar53 != 0 || bVar18 != 0) {
                        local_980._8_8_ =
                             *(undefined8 *)
                              (puVar48 + uVar51 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x30);
                        local_980._0_8_ =
                             *(undefined8 *)
                              (puVar48 + uVar51 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x30);
                        puStack_970 = (undefined1 *)
                                      *(undefined8 *)
                                       (puVar48 + uVar51 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x30);
                        puStack_968 = (undefined1 *)*(undefined8 *)(local_918 + uVar51 * 8 + 0x30);
                        Keccak_HashUpdatetimes4
                                  ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                                   (ulong)pp->input_output_size << 3);
                      }
                      puVar45 = local_918;
                      local_980._8_8_ =
                           *(undefined8 *)
                            (puVar48 + uVar51 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x48);
                      local_980._0_8_ =
                           *(undefined8 *)
                            (puVar48 + uVar51 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x48);
                      puStack_970 = (undefined1 *)
                                    *(undefined8 *)
                                     (puVar48 + uVar51 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x48);
                      puStack_968 = (undefined1 *)*(undefined8 *)(local_918 + uVar51 * 8 + 0x48);
                      Keccak_HashUpdatetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                                 (ulong)pp->view_size << 3);
                      bVar2 = pp->view_size;
                      bVar3 = pp->input_output_size;
                      uVar40 = 0;
                      if (bVar53 != 0 || bVar18 != 0) {
                        uVar40 = (uint)bVar3;
                      }
                      _local_980 = local_720;
                      Keccak_HashUpdatetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                                 0x10);
                      Keccak_HashFinaltimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)0x0);
                      local_980._8_8_ =
                           *(undefined8 *)
                            (puVar48 + uVar51 * 8 + (ulong)((uint)uVar6 * 0x90) + 0x78);
                      local_980._0_8_ =
                           *(undefined8 *)
                            (puVar48 + uVar51 * 8 + (ulong)((uint)uVar5 * 0x90) + 0x78);
                      puStack_970 = (undefined1 *)
                                    *(undefined8 *)
                                     (puVar48 + uVar51 * 8 + (ulong)((uint)uVar8 * 0x90) + 0x78);
                      puStack_968 = (undefined1 *)*(undefined8 *)(puVar45 + uVar51 * 8 + 0x78);
                      Keccak_HashSqueezetimes4
                                ((Keccak_HashInstancetimes4 *)local_700,(BitSequence **)local_980,
                                 (ulong)(((uint)bVar2 + (uint)bVar3 + uVar40) * 8));
                      uVar51 = local_930 & 1;
                      BVar31 = 1;
                      uVar35 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
                      local_930 = 0;
                    } while (uVar51 != 0);
                  }
                  puVar26 = puVar26 + 4;
                  uVar40 = local_8e8 + 4;
                  puVar49 = local_910;
                  uVar51 = local_908;
                } while (uVar40 < (uint)local_860);
              }
              if (uVar37 < uVar39) {
                iVar22 = uVar19 + 1;
                iVar21 = 0;
                if (iVar22 != 3) {
                  iVar21 = iVar22;
                }
                iVar23 = uVar19 + 2 + ((uVar19 + 2) / 3) * -3;
                do {
                  bVar18 = 0;
                  lVar50 = 0;
                  prf_round = (proof_round_t *)(puVar48 + (uint)*puVar26 * 0x90);
                  kdf_00 = (kdf_shake_t *)local_700;
                  bVar57 = true;
                  do {
                    bVar36 = bVar57;
                    _Var28 = true;
                    if (!(bool)(bVar36 & iVar22 != 3)) {
                      _Var28 = (_Bool)(bVar18 & iVar23 != 0);
                    }
                    uVar46 = (uint16_t)iVar21;
                    if (bVar36) {
                      uVar46 = (uint16_t)uVar19;
                    }
                    kdf_init_from_seed(kdf_00,prf_round->seeds[lVar50],salt,*puVar26,uVar46,_Var28,
                                       pp);
                    lVar50 = 1;
                    bVar18 = 1;
                    kdf_00 = (kdf_shake_t *)(local_640 + 0x20);
                    bVar57 = false;
                  } while (bVar36);
                  if (iVar22 != 3) {
                    Keccak_HashSqueeze((Keccak_HashInstance *)local_700,prf_round->input_shares[0],
                                       local_928);
                    prf_round->input_shares[0][local_920] =
                         prf_round->input_shares[0][local_920] & bVar32;
                  }
                  if (iVar23 != 0) {
                    Keccak_HashSqueeze((Keccak_HashInstance *)(local_640 + 0x20),
                                       prf_round->input_shares[1],local_928);
                    prf_round->input_shares[1][local_920] =
                         prf_round->input_shares[1][local_920] & bVar32;
                  }
                  mzd_from_char_array((mzd_local_t *)local_8e0,prf_round->input_shares[0],uVar24);
                  mzd_from_char_array((mzd_local_t *)local_8c0,prf_round->input_shares[1],uVar24);
                  uVar51 = local_870;
                  Keccak_HashSqueeze((Keccak_HashInstance *)local_700,local_840,local_870);
                  pvVar16 = local_900;
                  decompress_view(local_900,pp,local_840,0);
                  Keccak_HashSqueeze((Keccak_HashInstance *)(local_640 + 0x20),local_840,uVar51);
                  decompress_view(pvVar16,pp,local_840,1);
                  pvVar17 = local_8f8;
                  decompress_view(local_8f8,pp,prf_round->communicated_bits[1],1);
                  (*local_868)(context->m_plaintext,pvVar17,(in_out_shares_t *)local_8e0,pvVar16,
                               uVar19);
                  compress_view(prf_round->communicated_bits[0],pp,pvVar17,0);
                  uVar5 = (pp->lowmc).n;
                  if ((~DAT_001c310c & 0x20400) == 0) {
                    if (uVar5 < 0x81) {
                      local_8a0._0_16_ =
                           vpternlogq_avx512vl(*(undefined1 (*) [16])context->m_key[0].w64,local_8c0
                                               ,local_8e0._0_16_,0x96);
                    }
                    else {
                      auVar15._16_16_ = auStack_8b0;
                      auVar15._0_16_ = local_8c0;
                      auVar13._16_16_ = local_8e0._16_16_;
                      auVar13._0_16_ = local_8e0._0_16_;
                      local_8a0._0_32_ =
                           vpternlogq_avx512vl(*(undefined1 (*) [32])context->m_key[0].w64,auVar15,
                                               auVar13,0x96);
                    }
                  }
                  else {
                    local_8a0._0_16_ =
                         vpternlogq_avx512vl(local_8c0,local_8e0._0_16_,
                                             *(undefined1 (*) [16])context->m_key[0].w64,0x96);
                    if (0x80 < uVar5) {
                      local_8a0._16_16_ =
                           vpternlogq_avx512vl(*(undefined1 (*) [16])(context->m_key[0].w64 + 2),
                                               auStack_8b0,local_8e0._16_16_,0x96);
                    }
                  }
                  mzd_to_char_array(prf_round->output_shares[0],(mzd_local_t *)local_8e0,uVar24);
                  hash_commitment(pp,prf_round,0);
                  mzd_to_char_array(prf_round->output_shares[1],(mzd_local_t *)local_8c0,uVar24);
                  hash_commitment(pp,prf_round,1);
                  mzd_to_char_array(prf_round->output_shares[2],(mzd_local_t *)local_8a0,uVar24);
                  if (context->unruh == true) {
                    bVar53 = 1;
                    bVar18 = 0;
                    uVar40 = 0;
                    do {
                      if (!(bool)(~bVar18 & 1 | uVar19 != 1)) {
                        unruh_G(pp,prf_round,uVar40,true);
                        break;
                      }
                      unruh_G(pp,prf_round,uVar40,(_Bool)(uVar19 == 2 & bVar53));
                      uVar40 = 1;
                      bVar18 = 1;
                      bVar57 = bVar53 != 0;
                      bVar53 = 0;
                    } while (bVar57);
                  }
                  uVar37 = uVar37 + 1;
                  puVar26 = puVar26 + 1;
                  puVar49 = local_910;
                  uVar51 = local_908;
                } while (uVar37 != uVar39);
              }
            }
            uVar19 = uVar19 + 1;
            puVar26 = puVar49;
            if (uVar19 == 3) {
              auVar58 = ZEXT1664((undefined1  [16])0x0);
              auVar1 = vmovdqu64_avx512f(auVar58);
              auStack_580 = auVar1._10_54_;
              auVar1 = vmovdqa64_avx512f(auVar58);
              auStack_5c0 = auVar1._0_54_;
              local_58a = auVar1._54_10_;
              local_600 = vmovdqa64_avx512f(auVar58);
              local_640 = vmovdqa64_avx512f(auVar58);
              local_680 = vmovdqa64_avx512f(auVar58);
              local_700._64_64_ = vmovdqa64_avx512f(auVar58);
              local_700._0_64_ = vmovdqa64_avx512f(auVar58);
              uVar24 = (ulong)pp->num_rounds;
              bVar32 = pp->digest_size;
              bVar18 = pp->input_output_size;
              local_980[0] = 1;
              if (bVar32 == 0x20) {
                uVar33 = 0x540;
                uVar19 = 0x100;
              }
              else {
                uVar33 = 0x440;
                uVar19 = 0x200;
              }
              Keccak_HashInitialize((Keccak_HashInstance *)local_840,uVar33,uVar19,0,'\x1f');
              Keccak_HashUpdate((Keccak_HashInstance *)local_840,local_980,8);
              if (uVar24 == 0) {
                BVar31 = (ulong)bVar32 << 3;
              }
              else {
                puVar45 = salt + 0x98;
                uVar51 = 0;
                uVar54 = (ulong)((uint)bVar18 * 8);
                puVar38 = puVar48;
                do {
                  if (*(char *)(*(long *)(salt + 0x20) + uVar51) == '\x01') {
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar45,
                                      uVar54);
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -0x10),uVar54);
                    puVar27 = puVar38 + 0x68;
                  }
                  else if (*(char *)(*(long *)(salt + 0x20) + uVar51) == '\0') {
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -0x10),uVar54);
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -8),uVar54);
                    puVar27 = puVar45;
                  }
                  else {
                    puVar27 = puVar38 + 0x60;
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -8),uVar54);
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar45,
                                      uVar54);
                  }
                  Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar27,uVar54
                                   );
                  uVar51 = uVar51 + 1;
                  puVar38 = puVar38 + 0x90;
                  puVar45 = puVar45 + 0x90;
                } while (uVar24 != uVar51);
                puVar45 = salt + 0x50;
                uVar51 = 0;
                BVar31 = (ulong)bVar32 << 3;
                puVar38 = puVar48;
                do {
                  if (*(char *)(*(long *)(salt + 0x20) + uVar51) == '\x01') {
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar45,
                                      BVar31);
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -0x10),BVar31);
                    puVar27 = puVar38 + 0x20;
                  }
                  else if (*(char *)(*(long *)(salt + 0x20) + uVar51) == '\0') {
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -0x10),BVar31);
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -8),BVar31);
                    puVar27 = puVar45;
                  }
                  else {
                    puVar27 = puVar38 + 0x18;
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                      *(BitSequence **)(puVar45 + -8),BVar31);
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar45,
                                      BVar31);
                  }
                  Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar27,BVar31
                                   );
                  uVar51 = uVar51 + 1;
                  puVar38 = puVar38 + 0x90;
                  puVar45 = puVar45 + 0x90;
                } while (uVar24 != uVar51);
                if (context->unruh != false) {
                  uVar54 = 0;
                  puVar45 = salt + 0xb0;
                  iVar21 = (uint)pp->view_size + (uint)bVar18;
                  uVar51 = (ulong)(uint)(iVar21 * 8);
                  do {
                    if (*(char *)(*(long *)(salt + 0x20) + uVar54) == '\x01') {
                      Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar45,
                                        uVar51);
                      Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                        *(BitSequence **)(puVar45 + -0x10),uVar51);
                      puVar38 = puVar48 + 0x80;
                    }
                    else if (*(char *)(*(long *)(salt + 0x20) + uVar54) == '\0') {
                      Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                        *(BitSequence **)(puVar45 + -0x10),uVar51);
                      Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                        *(BitSequence **)(puVar45 + -8),uVar51);
                      puVar38 = puVar45;
                    }
                    else {
                      puVar38 = puVar48 + 0x78;
                      Keccak_HashUpdate((Keccak_HashInstance *)local_840,
                                        *(BitSequence **)(puVar45 + -8),uVar51);
                      Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar45,
                                        uVar51);
                    }
                    Keccak_HashUpdate((Keccak_HashInstance *)local_840,*(BitSequence **)puVar38,
                                      (ulong)(((uint)bVar18 + iVar21) * 8));
                    uVar54 = uVar54 + 1;
                    puVar48 = puVar48 + 0x90;
                    puVar45 = puVar45 + 0x90;
                  } while (uVar24 != uVar54);
                }
              }
              H3_public_key_message((hash_context *)local_840,pp,salt,context);
              Keccak_HashFinal((hash_context *)local_840,(BitSequence *)0x0);
              _local_980 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
              Keccak_HashSqueeze((hash_context *)local_840,local_980,BVar31);
              H3_compute((picnic_instance_t *)(ulong)pp->num_rounds,
                         (uint8_t *)(ulong)pp->digest_size,local_980);
              __s2 = *(void **)(salt + 0x20);
              iVar21 = memcmp(local_700,__s2,(ulong)pp->num_rounds);
              free(local_878);
              free(local_910);
              free(local_900);
              free(local_8f8);
              free(__s2);
              free(salt);
              return iVar21;
            }
          } while( true );
        }
      }
    }
LAB_0011951e:
    free(*(void **)(salt + 0x20));
    free(salt);
  }
  return -1;
}

Assistant:

int picnic_impl_verify(const picnic_instance_t* pp, const picnic_context_t* context,
                       const uint8_t* sig, size_t siglen) {
  sig_proof_t* prf = sig_proof_from_char_array(pp, context, sig, siglen);
  if (!prf) {
    return -1;
  }

  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_verify_implementation_f lowmc_verify_impl =
      get_zkbpp_lowmc_verify_implementation(&pp->lowmc);

  in_out_shares_t in_out_shares;
  view_t* views = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);
  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for and-gates

  // sort the different challenge rounds based on their H3 index, so we can use the 4x Keccak when
  // verifying since all of this is public information, there is no leakage
  sorting_helper_t* sorted_rounds = malloc(sizeof(sorting_helper_t) * num_rounds);

  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_VERIFY * 4 * aview_size);
  for (unsigned int current_chal = 0; current_chal < 3; current_chal++) {
    unsigned int num_current_rounds = 0;
    for (unsigned int r = 0; r < num_rounds; r++) {
      if (prf->challenge[r] == current_chal) {
        sorted_rounds[num_current_rounds++] = r;
      }
    }
    unsigned int i                 = 0;
    const sorting_helper_t* helper = sorted_rounds;
    for (; i < (num_current_rounds / 4) * 4; i += 4, helper += 4) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      const proof_round_t* prf0 = &prf->round[helper[0]];
      const proof_round_t* prf1 = &prf->round[helper[1]];
      const proof_round_t* prf2 = &prf->round[helper[2]];
      const proof_round_t* prf3 = &prf->round[helper[3]];

      {
        kdf_shake_x4_t kdfs[SC_VERIFY];
        const uint16_t round_numbers[4] = {helper[0], helper[1], helper[2], helper[3]};
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          const uint8_t* seeds[4]          = {prf0->seeds[j], prf1->seeds[j], prf2->seeds[j],
                                              prf3->seeds[j]};
          kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, player_number,
                                include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[0], prf0->input_shares[0], prf1->input_shares[0],
                                        prf2->input_shares[0], prf3->input_shares[0],
                                        input_output_size);
        }
        if (c_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[1], prf0->input_shares[1], prf1->input_shares[1],
                                        prf2->input_shares[1], prf3->input_shares[1],
                                        input_output_size);
        }
        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
          kdf_shake_x4_clear(&kdfs[j]);
        }
      }

      for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
        proof_round_t* round = &prf->round[helper[round_offset]];

        if (b_i) {
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        if (c_i) {
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
        }

        decompress_view(views, pp, round->communicated_bits[1], 1);
        // perform ZKB++ LowMC evaluation
        lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
        compress_view(round->communicated_bits[0], pp, views, 0);

        mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                  context->m_key);
        // recompute commitments
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        }
        mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                          input_output_size);
      }
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        hash_commitment_x4_verify(pp, prf->round, helper, j);
      }
#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G_x4_verify(pp, prf->round, helper, j,
                            (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
    for (; i < num_current_rounds; ++i, ++helper) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      proof_round_t* round = &prf->round[*helper];
      {
        kdf_shake_t kdfs[SC_VERIFY];
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, *helper, player_number,
                             include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_get_randomness(&kdfs[0], round->input_shares[0], input_output_size);
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        if (c_i) {
          kdf_shake_get_randomness(&kdfs[1], round->input_shares[1], input_output_size);
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }

        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          assert(view_size <= MAX_VIEW_SIZE);
          uint8_t tape_bytes[MAX_VIEW_SIZE];
          kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
          decompress_random_tape(rvec, pp, tape_bytes, j);
        }

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_clear(&kdfs[j]);
        }
      }

      decompress_view(views, pp, round->communicated_bits[1], 1);
      // perform ZKB++ LowMC evaluation
      lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
      compress_view(round->communicated_bits[0], pp, views, 0);

      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      // recompute commitments
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        hash_commitment(pp, round, j);
      }
      mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                        input_output_size);

#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G(pp, round, j, (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
  }

  assert(pp->num_rounds <= MAX_NUM_ROUNDS);
  unsigned char challenge[MAX_NUM_ROUNDS] = {0};
  H3_verify(pp, prf, context, challenge);
  const int success_status = memcmp(challenge, prf->challenge, pp->num_rounds);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  free(sorted_rounds);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);

  proof_free(prf);

  return success_status;
}